

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# userauth.c
# Opt level: O0

int libssh2_userauth_banner(LIBSSH2_SESSION *session,char **banner)

{
  char **banner_local;
  LIBSSH2_SESSION *session_local;
  
  if (session == (LIBSSH2_SESSION *)0x0) {
    session_local._4_4_ = -0x32;
  }
  else if (session->userauth_banner == (char *)0x0) {
    session_local._4_4_ = _libssh2_error(session,-0x32,"Missing userauth banner");
  }
  else {
    if (banner != (char **)0x0) {
      *banner = session->userauth_banner;
    }
    session_local._4_4_ = 0;
  }
  return session_local._4_4_;
}

Assistant:

LIBSSH2_API int
libssh2_userauth_banner(LIBSSH2_SESSION *session, char **banner)
{
    if(!session)
        return LIBSSH2_ERROR_MISSING_USERAUTH_BANNER;

    if(!session->userauth_banner) {
        return _libssh2_error(session,
                              LIBSSH2_ERROR_MISSING_USERAUTH_BANNER,
                              "Missing userauth banner");
    }

    if(banner)
        *banner = session->userauth_banner;

    return LIBSSH2_ERROR_NONE;
}